

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

string * google::protobuf::compiler::php::ClassNamePrefix<google::protobuf::EnumDescriptor>
                   (string *classname,EnumDescriptor *desc)

{
  FileDescriptor *this;
  string *psVar1;
  ulong uVar2;
  EnumDescriptor *in_RDX;
  string *in_RDI;
  string *prefix;
  FileDescriptor *in_stack_00000080;
  string *in_stack_00000088;
  
  this = EnumDescriptor::file(in_RDX);
  FileDescriptor::options(this);
  psVar1 = FileOptions::php_class_prefix_abi_cxx11_((FileOptions *)0x4aea4a);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::string((string *)in_RDI,(string *)psVar1);
  }
  else {
    EnumDescriptor::file(in_RDX);
    ReservedNamePrefix(in_stack_00000088,in_stack_00000080);
  }
  return in_RDI;
}

Assistant:

std::string ClassNamePrefix(const string& classname,
                            const DescriptorType* desc) {
  const string& prefix = (desc->file()->options()).php_class_prefix();
  if (!prefix.empty()) {
    return prefix;
  }

  return ReservedNamePrefix(classname, desc->file());
}